

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_search.hpp
# Opt level: O3

void __thiscall
pico_tree::internal::
search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<std::array<double,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_double>_>,_int>
::search_nearest(search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<std::array<double,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_double>_>,_int>
                 *this,node_type *node,scalar_type node_box_distance)

{
  int iVar1;
  int iVar2;
  kd_tree_node_euclidean<int,_double> *pkVar3;
  pointer piVar4;
  point_type *ppVar5;
  double *pdVar6;
  neighbor_type *pnVar7;
  int *piVar8;
  kd_tree_node_euclidean<int,_double> *node_00;
  long lVar9;
  kd_tree_node_euclidean<int,_double> *node_01;
  scalar_type sVar10;
  double node_box_distance_00;
  scalar_type d;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  node_01 = (node->
            super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>).left
  ;
  pkVar3 = (node->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>
           ).right;
  if (node_01 == (kd_tree_node_euclidean<int,_double> *)0x0 &&
      pkVar3 == (kd_tree_node_euclidean<int,_double> *)0x0) {
    iVar1 = (node->data).branch.split_dim;
    iVar2 = (node->data).leaf.end_idx;
    if (iVar1 < iVar2) {
      piVar4 = (this->indices_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = piVar4 + iVar1;
      ppVar5 = (this->query_).point_;
      pdVar6 = (((this->space_).space_)->storage_).data;
      pnVar7 = this->visitor_->nn_;
      sVar10 = pnVar7->distance;
      do {
        dVar11 = 0.0;
        lVar9 = 0;
        do {
          dVar13 = *(double *)((long)ppVar5->_M_elems + lVar9) -
                   *(double *)((long)pdVar6 + lVar9 + (long)*piVar8 * 0x10);
          dVar11 = dVar11 + dVar13 * dVar13;
          lVar9 = lVar9 + 8;
        } while (lVar9 != 0x10);
        if (dVar11 < sVar10) {
          pnVar7->index = *piVar8;
          pnVar7->distance = dVar11;
          sVar10 = dVar11;
        }
        piVar8 = piVar8 + 1;
      } while (piVar8 < piVar4 + iVar2);
    }
  }
  else {
    iVar1 = (node->data).branch.split_dim;
    dVar11 = ((this->query_).point_)->_M_elems[iVar1];
    dVar13 = (node->data).branch.left_max;
    dVar12 = (node->data).branch.right_min;
    dVar14 = (dVar13 + dVar12) - dVar11;
    dVar12 = dVar12 - dVar11;
    dVar13 = dVar13 - dVar11;
    dVar13 = (double)(~-(ulong)(dVar11 < dVar14) & (ulong)(dVar13 * dVar13) |
                     (ulong)(dVar12 * dVar12) & -(ulong)(dVar11 < dVar14));
    node_00 = pkVar3;
    if (dVar11 < dVar14) {
      node_00 = node_01;
    }
    search_nearest(this,node_00,node_box_distance);
    dVar12 = (this->node_box_offset_).elems_._M_elems[iVar1];
    node_box_distance_00 = (node_box_distance - dVar12) + dVar13;
    if (node_box_distance_00 <= this->visitor_->nn_->distance) {
      if (dVar11 < dVar14) {
        node_01 = pkVar3;
      }
      (this->node_box_offset_).elems_._M_elems[iVar1] = dVar13;
      search_nearest(this,node_01,node_box_distance_00);
      (this->node_box_offset_).elems_._M_elems[iVar1] = dVar12;
    }
  }
  return;
}

Assistant:

inline void search_nearest(
      node_type const* const node, scalar_type node_box_distance) {
    if (node->is_leaf()) {
      auto begin = indices_.begin() + node->data.leaf.begin_idx;
      auto const end = indices_.begin() + node->data.leaf.end_idx;
      for (; begin < end; ++begin) {
        visitor_(*begin, metric_(query_.begin(), query_.end(), space_[*begin]));
      }
    } else {
      // Go left or right and then check if we should still go down the other
      // side based on the current minimum distance.
      size_t const split_dim = static_cast<size_t>(node->data.branch.split_dim);
      scalar_type const v = query_[split_dim];
      scalar_type new_offset;
      node_type const* node_1st;
      node_type const* node_2nd;

      // On equals we would possibly need to go left as well. However, this is
      // handled by the if statement below this one: the check that max search
      // radius still hits the split value after having traversed the first
      // branch.
      // If left_max - v > 0, this means that the query is inside the left node,
      // if right_min - v < 0 it's inside the right one. For the area in between
      // we just pick the closest one by summing them.
      if ((node->data.branch.left_max + node->data.branch.right_min - v - v) >
          0) {
        node_1st = node->left;
        node_2nd = node->right;
        new_offset = metric_(node->data.branch.right_min - v);
      } else {
        node_1st = node->right;
        node_2nd = node->left;
        new_offset = metric_(node->data.branch.left_max - v);
      }

      // The distance and offset for node_1st is the same as that of its parent.
      search_nearest(node_1st, node_box_distance);

      // Calculate the distance to node_2nd.
      // NOTE: This method only works with Lp norms to which the exponent is not
      // applied.
      scalar_type const old_offset = node_box_offset_[split_dim];
      node_box_distance = node_box_distance - old_offset + new_offset;

      // The value visitor->max() contains the current nearest neighbor distance
      // or otherwise current maximum search distance. When testing against the
      // split value we determine if we should go into the neighboring node.
      if (visitor_.max() >= node_box_distance) {
        node_box_offset_[split_dim] = new_offset;
        search_nearest(node_2nd, node_box_distance);
        node_box_offset_[split_dim] = old_offset;
      }
    }
  }